

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O0

void __thiscall
cmLocalCommonGenerator::cmLocalCommonGenerator
          (cmLocalCommonGenerator *this,cmGlobalGenerator *gg,cmMakefile *mf,string *wd)

{
  cmMakefile *this_00;
  char *pcVar1;
  allocator local_61;
  string local_60;
  char *local_40;
  char *config;
  string *local_28;
  string *wd_local;
  cmMakefile *mf_local;
  cmGlobalGenerator *gg_local;
  cmLocalCommonGenerator *this_local;
  
  local_28 = wd;
  wd_local = (string *)mf;
  mf_local = (cmMakefile *)gg;
  gg_local = (cmGlobalGenerator *)this;
  cmLocalGenerator::cmLocalGenerator(&this->super_cmLocalGenerator,gg,mf);
  (this->super_cmLocalGenerator)._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalCommonGenerator_00be1158;
  std::__cxx11::string::string((string *)&this->WorkingDirectory,(string *)local_28);
  std::__cxx11::string::string((string *)&this->ConfigName);
  this_00 = (this->super_cmLocalGenerator).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_60,"CMAKE_BUILD_TYPE",&local_61);
  pcVar1 = cmMakefile::GetDefinition(this_00,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  local_40 = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::operator=((string *)&this->ConfigName,"");
  }
  else {
    std::__cxx11::string::operator=((string *)&this->ConfigName,pcVar1);
  }
  return;
}

Assistant:

cmLocalCommonGenerator::cmLocalCommonGenerator(cmGlobalGenerator* gg,
                                               cmMakefile* mf,
                                               std::string const& wd)
  : cmLocalGenerator(gg, mf)
  , WorkingDirectory(wd)
{
  // Store the configuration name that will be generated.
  if (const char* config = this->Makefile->GetDefinition("CMAKE_BUILD_TYPE")) {
    // Use the build type given by the user.
    this->ConfigName = config;
  } else {
    // No configuration type given.
    this->ConfigName = "";
  }
}